

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O0

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CCompoundStm *stm)

{
  bool bVar1;
  pointer pIVar2;
  CCompoundStm *stm_local;
  CConvertVisitor *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->leftStatement);
  if (bVar1) {
    pIVar2 = std::unique_ptr<IStatement,_std::default_delete<IStatement>_>::operator->
                       (&stm->leftStatement);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->rightStatement);
  if (bVar1) {
    pIVar2 = std::unique_ptr<IStatement,_std::default_delete<IStatement>_>::operator->
                       (&stm->rightStatement);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  }
  return;
}

Assistant:

void CConvertVisitor::Visit(CCompoundStm &stm) {
	if (stm.leftStatement) {
		stm.leftStatement->Accept(*this);
	}
	if (stm.rightStatement) {
		stm.rightStatement->Accept(*this);
	}
}